

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall cmConfigureLog::EnsureInit(cmConfigureLog *this)

{
  char cVar1;
  string_view key;
  string name;
  
  if (this->Opened == false) {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      __assert_fail("!this->Stream.is_open()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmConfigureLog.cxx"
                    ,0x66,"void cmConfigureLog::EnsureInit()");
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[24]>(&name,&this->LogDir,(char (*) [24])0x70321b);
    std::ofstream::open((char *)&this->Stream,(_Ios_Openmode)name._M_dataplus._M_p);
    this->Opened = true;
    std::operator<<(&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"\n---\n");
    key._M_str = "events";
    key._M_len = 6;
    BeginObject(this,key);
    std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void cmConfigureLog::EnsureInit()
{
  if (this->Opened) {
    return;
  }
  assert(!this->Stream.is_open());

  std::string name = cmStrCat(this->LogDir, "/CMakeConfigureLog.yaml");
  this->Stream.open(name.c_str(), std::ios::out | std::ios::app);

  this->Opened = true;

  this->Stream << "\n---\n";
  this->BeginObject("events"_s);
}